

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool>
 __thiscall
nanojson3::internal::
key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>
::
operate_emplace<(nanojson3::internal::key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>::operate_insert_option)1,std::__cxx11::string_const&,int&>
          (key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,int *value)

{
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>
  _Var1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  pair<__gnu_cxx::__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>,_bool>
  pVar3;
  tuple<int_&> local_60;
  _Variadic_union<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
  local_58;
  
  _Var1 = operate_find<(nanojson3::internal::key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>::operate_find_option)0,__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,nanojson3::json>*,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>,std::__cxx11::string>
                    (this,*(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
                            **)this,
                     *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
                       **)(this + 8),key);
  if (_Var1._M_current ==
      *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
        **)(this + 8)) {
    local_60.super__Tuple_impl<0UL,_int_&>.super__Head_base<0UL,_int_&,_false>._M_head_impl =
         (_Tuple_impl<0UL,_int_&>)(_Tuple_impl<0UL,_int_&>)value;
    local_58._M_rest._0_8_ = (undefined8)key;
    std::
    vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>
    ::
    emplace_back<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<int&>>
              ((vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>
                *)this,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_58,&local_60);
    _Var1._M_current =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>
          *)(*(long *)(this + 8) + -0x50);
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    json::json<int_&,_nullptr>((json *)&local_58,value);
    std::__detail::__variant::
    _Move_assign_base<false,_std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
    ::operator=((_Move_assign_base<false,_std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                 *)&(_Var1._M_current)->second,
                (_Move_assign_base<false,_std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                 *)&local_58);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                         *)&local_58);
    uVar2 = 0;
  }
  pVar3._8_8_ = uVar2;
  pVar3.first._M_current = _Var1._M_current;
  return pVar3;
}

Assistant:

[[nodiscard]] std::pair<iterator, bool> operate_emplace(Key&& key, Value&&... value)
            {
                if (auto it = operate_find(begin(), end(), key); it != end())
                {
                    if constexpr (on_already_exists == or_assign) it->second = mapped_type(std::forward<decltype(value)>(value)...);
                    return {it, false};
                }
                else
                {
                    base_container::emplace_back(std::piecewise_construct, std::forward_as_tuple(std::forward<decltype(key)>(key)), std::forward_as_tuple(std::forward<decltype(value)>(value)...));
                    return {base_container::end() - 1, true};
                }
            }